

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O1

IceTVoid * stateAllocate(IceTEnum pname,IceTSizeType num_entries,IceTEnum type,IceTState state)

{
  IceTState pIVar1;
  IceTTimeStamp IVar2;
  IceTInt IVar3;
  void *pvVar4;
  IceTVoid *pIVar5;
  
  pIVar1 = state + pname;
  if ((pIVar1->num_entries == num_entries) && (pIVar1->type == type)) {
    IVar2 = icetGetTimeStamp::current_time + 1;
    pIVar1->mod_time = icetGetTimeStamp::current_time;
    icetGetTimeStamp::current_time = IVar2;
    pIVar5 = pIVar1->data;
  }
  else {
    if (num_entries < 1) {
      pIVar1->type = type;
      pIVar1->num_entries = 0;
      pIVar1->data = (void *)0x0;
      IVar2 = icetGetTimeStamp::current_time + 1;
      pIVar1->mod_time = icetGetTimeStamp::current_time;
      icetGetTimeStamp::current_time = IVar2;
    }
    else {
      if ((0 < pIVar1->num_entries) && (pIVar1->type != 0)) {
        free(pIVar1->data);
        pIVar1->type = 0;
        pIVar1->num_entries = 0;
        pIVar1->data = (void *)0x0;
        pIVar1->mod_time = 0;
      }
      IVar3 = icetTypeWidth(type);
      pvVar4 = malloc((long)(IVar3 * num_entries));
      if (pvVar4 != (void *)0x0) {
        pIVar1->type = type;
        pIVar1->num_entries = num_entries;
        pIVar1->data = pvVar4;
        IVar2 = icetGetTimeStamp::current_time + 1;
        pIVar1->mod_time = icetGetTimeStamp::current_time;
        icetGetTimeStamp::current_time = IVar2;
        return pvVar4;
      }
      icetRaiseDiagnostic("Could not allocate memory for state variable.",0xfffffffc,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/state.c"
                          ,0x217);
    }
    pIVar5 = (IceTVoid *)0x0;
  }
  return pIVar5;
}

Assistant:

static IceTVoid *stateAllocate(IceTEnum pname,
                               IceTSizeType num_entries,
                               IceTEnum type,
                               IceTState state)
{
    IceTVoid *buffer;

    stateCheck(pname, state);

    if (   (num_entries == state[pname].num_entries)
        && (type == state[pname].type) ) {
        /* Return the current buffer. */
        state[pname].mod_time = icetGetTimeStamp();
        buffer = state[pname].data;
    } else if (num_entries > 0) {
        stateFree(pname, state);
        /* Create a new buffer. */
        buffer = malloc(STATE_DATA_ALLOCATE(type, num_entries));
        if (buffer == NULL) {
            icetRaiseError("Could not allocate memory for state variable.",
                           ICET_OUT_OF_MEMORY);
            return NULL;
        }
#ifdef ICET_STATE_CHECK_MEM
        /* Skip past padding. */
        buffer = (IceTByte *)buffer + STATE_PADDING_SIZE;
#endif

        state[pname].type = type;
        state[pname].num_entries = num_entries;
        state[pname].data = buffer;
        state[pname].mod_time = icetGetTimeStamp();

#ifdef ICET_STATE_CHECK_MEM
        /* Set padding data. */
        {
            IceTSizeType i;
            IceTByte *padding;
            padding = STATE_DATA_PRE_PADDING(pname, state);
            for (i = 0; i < STATE_PADDING_SIZE; i++) {
                padding[i] = g_pre_padding[i];
            }
            padding = STATE_DATA_POST_PADDING(pname, state);
            for (i = 0; i < STATE_PADDING_SIZE; i++) {
                padding[i] = g_post_padding[i];
            }
        }
#endif
    } else { /* num_entries <= 0 */
        buffer = NULL;

        state[pname].type = type;
        state[pname].num_entries = 0;
        state[pname].data = buffer;
        state[pname].mod_time = icetGetTimeStamp();
    }

#ifdef ICET_STATE_CHECK_MEM
    memset(buffer, 0xDC, STATE_DATA_WIDTH(type, num_entries));
#endif
    return buffer;
}